

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

deUint32 rr::anon_unknown_19::readIndexArray(IndexType type,void *ptr,size_t ndx)

{
  uint local_28;
  ushort local_22;
  deUint32 retVal_1;
  deUint16 retVal;
  size_t ndx_local;
  void *ptr_local;
  IndexType type_local;
  
  if (type == INDEXTYPE_UINT8) {
    ptr_local._4_4_ = (uint)*(byte *)((long)ptr + ndx);
  }
  else {
    _retVal_1 = ndx;
    ndx_local = (size_t)ptr;
    ptr_local._0_4_ = type;
    if (type == INDEXTYPE_UINT16) {
      ::deMemcpy(&local_22,(void *)((long)ptr + ndx * 2),2);
      ptr_local._4_4_ = (uint)local_22;
    }
    else if (type == INDEXTYPE_UINT32) {
      ::deMemcpy(&local_28,(void *)((long)ptr + ndx * 4),4);
      ptr_local._4_4_ = local_28;
    }
    else {
      ptr_local._4_4_ = 0;
    }
  }
  return ptr_local._4_4_;
}

Assistant:

deUint32 readIndexArray (const IndexType type, const void* ptr, size_t ndx)
{
	switch (type)
	{
		case INDEXTYPE_UINT8:
			return ((const deUint8*)ptr)[ndx];

		case INDEXTYPE_UINT16:
		{
			deUint16 retVal;
			deMemcpy(&retVal, (const deUint8*)ptr + ndx * sizeof(deUint16), sizeof(deUint16));

			return retVal;
		}

		case INDEXTYPE_UINT32:
		{
			deUint32 retVal;
			deMemcpy(&retVal, (const deUint8*)ptr + ndx * sizeof(deUint32), sizeof(deUint32));

			return retVal;
		}

		default:
			DE_ASSERT(false);
			return 0;
	}
}